

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_tinf.c
# Opt level: O0

greatest_test_res inflate_max_matchdist(void)

{
  uint uVar1;
  ulong local_8028;
  size_t i;
  int res;
  uint dlen;
  uchar out [32771];
  greatest_test_res local_c;
  
  i._4_4_ = 0x8003;
  memset(&res,0xff,0x8003);
  i._0_4_ = tinf_uncompress(&res,(uint *)((long)&i + 4),inflate_max_matchdist::data,0x35);
  if (((int)i == 0) && (i._4_4_ == 0x8003)) {
    uVar1 = greatest_info.assertions + 2;
    if ((((char)res == '\x02') && (res._1_1_ == '\x01')) && (res._2_1_ == '\0')) {
      for (local_8028 = 3; local_8028 < 0x8000; local_8028 = local_8028 + 1) {
        if (*(char *)((long)&res + local_8028) != '\0') {
          greatest_info.fail_file =
               "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]tinf/test/test_tinf.c";
          greatest_info.fail_line = 0x167;
          greatest_info.msg = (char *)0x0;
          if ((greatest_info.flags & 4) == 0) {
            greatest_info.assertions = uVar1;
            greatest_info.fail_line = 0x167;
            greatest_info.fail_file =
                 "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]tinf/test/test_tinf.c";
            greatest_info.msg = (char *)0x0;
            return GREATEST_TEST_RES_FAIL;
          }
          greatest_info.assertions = uVar1;
          abort();
        }
      }
      if (out[0x7ff8] == '\x02') {
        if (out[0x7ff9] == '\x01') {
          greatest_info.assertions = greatest_info.assertions + 5;
          if (out[0x7ffa] == '\0') {
            greatest_info.msg = (char *)0x0;
            local_c = GREATEST_TEST_RES_PASS;
          }
          else {
            greatest_info.fail_file =
                 "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]tinf/test/test_tinf.c";
            greatest_info.fail_line = 0x16d;
            greatest_info.msg = "out[ARRAY_SIZE(out) - 1] == 0";
            if ((greatest_info.flags & 4) != 0) {
              abort();
            }
            local_c = GREATEST_TEST_RES_FAIL;
          }
        }
        else {
          greatest_info.fail_file =
               "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]tinf/test/test_tinf.c";
          greatest_info.fail_line = 0x16c;
          greatest_info.msg = "out[ARRAY_SIZE(out) - 2] == 1";
          if ((greatest_info.flags & 4) != 0) {
            greatest_info.assertions = greatest_info.assertions + 4;
            abort();
          }
          local_c = GREATEST_TEST_RES_FAIL;
          greatest_info.assertions = greatest_info.assertions + 4;
        }
      }
      else {
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]tinf/test/test_tinf.c";
        greatest_info.fail_line = 0x16b;
        greatest_info.msg = "out[ARRAY_SIZE(out) - 3] == 2";
        if ((greatest_info.flags & 4) != 0) {
          greatest_info.assertions = greatest_info.assertions + 3;
          abort();
        }
        local_c = GREATEST_TEST_RES_FAIL;
        greatest_info.assertions = greatest_info.assertions + 3;
      }
    }
    else {
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]tinf/test/test_tinf.c";
      greatest_info.fail_line = 0x163;
      greatest_info.msg = "out[0] == 2 && out[1] == 1 && out[2] == 0";
      if ((greatest_info.flags & 4) != 0) {
        greatest_info.assertions = uVar1;
        abort();
      }
      local_c = GREATEST_TEST_RES_FAIL;
      greatest_info.assertions = uVar1;
    }
  }
  else {
    greatest_info.fail_file =
         "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]tinf/test/test_tinf.c";
    greatest_info.fail_line = 0x161;
    greatest_info.msg = "res == TINF_OK && dlen == ARRAY_SIZE(out)";
    if ((greatest_info.flags & 4) != 0) {
      greatest_info.assertions = greatest_info.assertions + 1;
      abort();
    }
    local_c = GREATEST_TEST_RES_FAIL;
    greatest_info.assertions = greatest_info.assertions + 1;
  }
  return local_c;
}

Assistant:

TEST inflate_max_matchdist(void)
{
	/* A match of length 3 with a distance of 32768 */
	static const unsigned char data[] = {
		0xED, 0xDD, 0x01, 0x01, 0x00, 0x00, 0x08, 0x02, 0x20, 0xED,
		0xFF, 0xE8, 0xFA, 0x11, 0x1C, 0x61, 0x9A, 0xF7, 0x00, 0x00,
		0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
		0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
		0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0xE0,
		0xFE, 0xFF, 0x05
	};
	unsigned char out[32771];
	unsigned int dlen = ARRAY_SIZE(out);
	int res;
	size_t i;

	memset(out, 0xFF, ARRAY_SIZE(out));

	res = tinf_uncompress(out, &dlen, data, ARRAY_SIZE(data));

	ASSERT(res == TINF_OK && dlen == ARRAY_SIZE(out));

	ASSERT(out[0] == 2 && out[1] == 1 && out[2] == 0);

	for (i = 3; i < ARRAY_SIZE(out) - 3; ++i) {
		if (out[i]) {
			FAIL();
		}
	}

	ASSERT(out[ARRAY_SIZE(out) - 3] == 2);
	ASSERT(out[ARRAY_SIZE(out) - 2] == 1);
	ASSERT(out[ARRAY_SIZE(out) - 1] == 0);

	PASS();
}